

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

int Curl_hash_delete(Curl_hash *h,void *key,size_t key_len)

{
  Curl_llist_element *e;
  size_t sVar1;
  Curl_llist *pCVar2;
  Curl_llist *pCVar3;
  
  pCVar3 = h->table;
  if (pCVar3 != (Curl_llist *)0x0) {
    sVar1 = (*h->hash_func)(key,key_len,(long)h->slots);
    pCVar3 = pCVar3 + sVar1;
    pCVar2 = pCVar3;
    while (e = pCVar2->head, e != (Curl_llist_element *)0x0) {
      sVar1 = (*h->comp_func)((void *)((long)e->ptr + 0x28),*(size_t *)((long)e->ptr + 0x20),key,
                              key_len);
      if (sVar1 != 0) {
        Curl_llist_remove(pCVar3,e,h);
        h->size = h->size - 1;
        return 0;
      }
      pCVar2 = (Curl_llist *)&e->next;
    }
  }
  return 1;
}

Assistant:

int Curl_hash_delete(struct Curl_hash *h, void *key, size_t key_len)
{
  struct Curl_llist_element *le;
  struct Curl_llist *l;

  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  if(h->table) {
    l = FETCH_LIST(h, key, key_len);

    for(le = l->head; le; le = le->next) {
      struct Curl_hash_element *he = le->ptr;
      if(h->comp_func(he->key, he->key_len, key, key_len)) {
        Curl_llist_remove(l, le, (void *) h);
        --h->size;
        return 0;
      }
    }
  }
  return 1;
}